

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall
BackwardPass::ProcessArrayRegOpndUse(BackwardPass *this,Instr *instr,ArrayRegOpnd *arrayRegOpnd)

{
  ushort uVar1;
  BasicBlock *pBVar2;
  code *pcVar3;
  bool bVar4;
  undefined1 uVar5;
  BOOLEAN BVar6;
  OpndKind OVar7;
  char cVar8;
  bool bVar9;
  ObjectType OVar10;
  ObjectType OVar11;
  uint uVar12;
  undefined4 *puVar13;
  StackSym *pSVar14;
  RegOpnd *pRVar15;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  ulong uVar16;
  Instr *pIVar17;
  Instr *this_00;
  IndirOpnd *pIVar18;
  Opnd *pOVar19;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  Opnd *checkedSrc;
  Opnd *pOVar20;
  Opnd *checkedSrc_1;
  RegOpnd *this_02;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_52;
  undefined4 *local_50;
  ArrayRegOpnd *local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  uint local_38;
  ValueType arrayValueType;
  
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1230,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
    if (!bVar4) goto LAB_003e31c1;
    *puVar13 = 0;
  }
  if (this->isCollectionPass == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1231,"(!IsCollectionPass())","!IsCollectionPass()");
    if (!bVar4) goto LAB_003e31c1;
    *puVar13 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1232,"(instr)","instr");
    if (!bVar4) goto LAB_003e31c1;
    *puVar13 = 0;
  }
  if (arrayRegOpnd == (ArrayRegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1233,"(arrayRegOpnd)","arrayRegOpnd");
    if (!bVar4) goto LAB_003e31c1;
    *puVar13 = 0;
  }
  if (((arrayRegOpnd->headSegmentSym == (StackSym *)0x0) &&
      (arrayRegOpnd->headSegmentLengthSym == (StackSym *)0x0)) &&
     (pSVar14 = IR::ArrayRegOpnd::LengthSym(arrayRegOpnd), pSVar14 == (StackSym *)0x0)) {
    return;
  }
  local_3a = (arrayRegOpnd->super_RegOpnd).super_Opnd.m_valueType.field_0;
  uVar5 = ValueType::IsLikelyTypedArray((ValueType *)&local_3a.field_0);
  bVar4 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_3a.field_0);
  if ((bool)uVar5 == bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x123c,"(isJsArray == arrayValueType.IsArrayOrObjectWithArray())",
                       "isJsArray == arrayValueType.IsArrayOrObjectWithArray()");
    if (!bVar4) goto LAB_003e31c1;
    *puVar13 = 0;
  }
  bVar4 = ValueType::IsOptimizedTypedArray((ValueType *)&local_3a.field_0);
  if ((bool)uVar5 != bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x123d,"(!isJsArray == arrayValueType.IsOptimizedTypedArray())",
                       "!isJsArray == arrayValueType.IsOptimizedTypedArray()");
    if (!bVar4) goto LAB_003e31c1;
    *puVar13 = 0;
  }
  pBVar2 = this->currentBlock;
  local_48 = arrayRegOpnd;
  if ((this->currentPrePassLoop != (Loop *)0x0) ||
     ((pSVar14 = arrayRegOpnd->headSegmentSym, pSVar14 == (StackSym *)0x0 &&
      (arrayRegOpnd->headSegmentLengthSym == (StackSym *)0x0)))) goto LAB_003e24b3;
  if (((bool)uVar5) || (instr->m_opcode != NoImplicitCallUses)) {
    uVar1 = *(ushort *)&instr->field_0x36;
    if ((uVar1 >> 10 & 1) == 0 || pSVar14 == (StackSym *)0x0) {
      local_50 = (undefined4 *)((ulong)local_50 & 0xffffffff00000000);
    }
    else {
      BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                        (pBVar2->upwardExposedUses,(pSVar14->super_Sym).m_id);
      local_50 = (undefined4 *)CONCAT44(local_50._4_4_,(int)CONCAT71(extraout_var,BVar6 == '\0'));
      uVar1 = *(ushort *)&instr->field_0x36;
    }
    if ((((uVar1 >> 0xb & 1) != 0) && (arrayRegOpnd->headSegmentLengthSym != (StackSym *)0x0)) &&
       (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                          (pBVar2->upwardExposedUses,
                           (arrayRegOpnd->headSegmentLengthSym->super_Sym).m_id), BVar6 == '\0')) {
      uVar16 = CONCAT71(extraout_var_00,1);
      if ((instr->field_0x37 & 0x10) == 0) goto LAB_003e26d2;
      arrayValueType.field_0.bits._1_1_ = uVar5;
      pIVar17 = GlobOpt::FindUpperBoundsCheckInstr(this->globOpt,instr);
      if (pIVar17 == (Instr *)0x0 || pIVar17 == instr) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1250,"(upperBoundCheck && upperBoundCheck != instr)",
                           "upperBoundCheck && upperBoundCheck != instr");
        if (!bVar4) goto LAB_003e31c1;
        *puVar13 = 0;
        arrayRegOpnd = local_48;
      }
      pRVar15 = IR::Opnd::AsRegOpnd(pIVar17->m_src2);
      if (pRVar15->m_sym != arrayRegOpnd->headSegmentLengthSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1251,
                           "(upperBoundCheck->GetSrc2()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym())"
                           ,
                           "upperBoundCheck->GetSrc2()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym()"
                          );
        if (!bVar4) goto LAB_003e31c1;
        *puVar13 = 0;
      }
      this_00 = GlobOpt::FindArraySegmentLoadInstr(this->globOpt,pIVar17);
      pRVar15 = IR::Opnd::AsRegOpnd(this_00->m_dst);
      if (pRVar15->m_sym != local_48->headSegmentLengthSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1256,
                           "(headSegmentLengthLoad->GetDst()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym())"
                           ,
                           "headSegmentLengthLoad->GetDst()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym()"
                          );
        if (!bVar4) goto LAB_003e31c1;
        *puVar13 = 0;
      }
      pIVar18 = IR::Opnd::AsIndirOpnd(this_00->m_src1);
      if (pIVar18->m_baseOpnd->m_sym !=
          (&(local_48->super_RegOpnd).m_sym)[(ulong)(arrayValueType.field_0.bits._1_1_ ^ 1) * 2]) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1259,
                           "(headSegmentLengthLoad->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->m_sym == (isJsArray ? arrayRegOpnd->HeadSegmentSym() : arrayRegOpnd->m_sym))"
                           ,
                           "headSegmentLengthLoad->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->m_sym == (isJsArray ? arrayRegOpnd->HeadSegmentSym() : arrayRegOpnd->m_sym)"
                          );
        if (!bVar4) goto LAB_003e31c1;
        *puVar13 = 0;
      }
      pOVar19 = IR::Instr::UnlinkSrc1(this_00);
      pOVar19 = IR::Instr::ReplaceSrc2(pIVar17,pOVar19);
      this_00->m_opcode = Nop;
      uVar16 = CONCAT71((int7)((ulong)pOVar19 >> 8),1);
      uVar12 = (uint)uVar16;
      arrayRegOpnd = local_48;
      uVar5 = arrayValueType.field_0.bits._1_1_;
      if (arrayValueType.field_0.bits._1_1_ != '\0') goto LAB_003e26d2;
      local_50 = (undefined4 *)((ulong)local_50 & 0xffffffff00000000);
LAB_003e2e27:
      local_38 = uVar12;
      arrayValueType.field_0.bits._1_1_ = uVar5;
      if (instr->m_opcode == NoImplicitCallUses) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1207,"(instr->m_opcode != Js::OpCode::NoImplicitCallUses)",
                           "instr->m_opcode != Js::OpCode::NoImplicitCallUses");
        if (!bVar4) goto LAB_003e31c1;
        *puVar13 = 0;
      }
      for (pIVar17 = instr->m_prev; pIVar17 != (Instr *)0x0; pIVar17 = pIVar17->m_prev) {
        if ((pIVar17->m_kind == InstrKindLabel) || (pIVar17->m_kind == InstrKindProfiledLabel)) {
LAB_003e2ed4:
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          goto LAB_003e2ef0;
        }
        bVar4 = IR::Instr::IsRealInstr(pIVar17);
        if (bVar4) {
          if ((pIVar17->m_kind != InstrKindByteCodeUses) || (pIVar17->m_opcode != ByteCodeUses))
          goto LAB_003e2ed4;
        }
        else if (pIVar17->m_opcode == NoImplicitCallUses) goto LAB_003e2ed4;
      }
      goto LAB_003e3062;
    }
    uVar16 = 0;
LAB_003e26d2:
    uVar12 = (uint)uVar16;
    if (((char)local_50 == '\0') && ((char)uVar16 == '\0')) goto LAB_003e24b3;
    if (uVar5 == '\0') goto LAB_003e2e27;
    if ((char)uVar16 != '\0') {
      local_38 = uVar12;
      pRVar15 = IR::RegOpnd::New(arrayRegOpnd->headSegmentLengthSym,
                                 arrayRegOpnd->headSegmentLengthSym->m_type,instr->m_func);
      if (instr->m_opcode == NoImplicitCallUses) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1207,"(instr->m_opcode != Js::OpCode::NoImplicitCallUses)",
                           "instr->m_opcode != Js::OpCode::NoImplicitCallUses");
        if (!bVar4) goto LAB_003e31c1;
        *puVar13 = 0;
      }
      for (pIVar17 = instr->m_prev; pIVar17 != (Instr *)0x0; pIVar17 = pIVar17->m_prev) {
        if ((pIVar17->m_kind == InstrKindLabel) || (pIVar17->m_kind == InstrKindProfiledLabel)) {
LAB_003e2be5:
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          arrayValueType.field_0.bits._1_1_ = uVar5;
          goto LAB_003e2c04;
        }
        bVar4 = IR::Instr::IsRealInstr(pIVar17);
        if (bVar4) {
          if ((pIVar17->m_kind != InstrKindByteCodeUses) || (pIVar17->m_opcode != ByteCodeUses))
          goto LAB_003e2be5;
        }
        else if (pIVar17->m_opcode == NoImplicitCallUses) goto LAB_003e2be5;
      }
LAB_003e2cd2:
      IR::RegOpnd::FreeInternal(pRVar15,instr->m_func);
      this_02 = (RegOpnd *)0x0;
      bVar4 = (char)local_50 == '\0';
      arrayRegOpnd = local_48;
      goto LAB_003e3161;
    }
    this_02 = (RegOpnd *)0x0;
LAB_003e29af:
    cVar8 = (char)uVar16;
    if ((char)local_50 != '\0') goto LAB_003e3166;
    goto LAB_003e3195;
  }
LAB_003e2508:
  if (arrayRegOpnd->headSegmentSym != (StackSym *)0x0) {
    ProcessStackSymUse(this,arrayRegOpnd->headSegmentSym,'\x01');
    BVSparse<Memory::JitArenaAllocator>::Set
              (pBVar2->noImplicitCallUses,(arrayRegOpnd->headSegmentSym->super_Sym).m_id);
    BVSparse<Memory::JitArenaAllocator>::Set
              (pBVar2->noImplicitCallJsArrayHeadSegmentSymUses,
               (arrayRegOpnd->headSegmentSym->super_Sym).m_id);
  }
  goto LAB_003e254e;
LAB_003e2c04:
  uVar5 = arrayValueType.field_0.bits._1_1_;
  if (pIVar17->m_opcode == NoImplicitCallUses) {
    pOVar19 = pIVar17->m_src2;
    pOVar20 = pIVar17->m_src1;
    bVar4 = true;
LAB_003e2c1f:
    if (pOVar20 != (Opnd *)0x0) {
      bVar9 = IR::Opnd::IsEqual(pOVar20,&pRVar15->super_Opnd);
      if (!bVar9) goto LAB_003e2ca9;
      OVar7 = IR::Opnd::GetKind(pOVar20);
      if (OVar7 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar9) goto LAB_003e31c1;
        *puVar13 = 0;
      }
      if ((StackSym *)pOVar20[1]._vptr_Opnd != local_48->headSegmentLengthSym) goto LAB_003e2ca9;
      IR::RegOpnd::FreeInternal(pRVar15,instr->m_func);
      uVar5 = arrayValueType.field_0.bits._1_1_;
      arrayRegOpnd = local_48;
      if (pIVar17->m_dst != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x12a7,"(!noImplicitCallUsesInstr->GetDst())",
                           "!noImplicitCallUsesInstr->GetDst()");
        if (!bVar4) goto LAB_003e31c1;
        *puVar13 = 0;
      }
      pOVar19 = pIVar17->m_src1;
      if (pOVar19 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x12a8,"(noImplicitCallUsesInstr->GetSrc1())",
                           "noImplicitCallUsesInstr->GetSrc1()");
        if (!bVar4) goto LAB_003e31c1;
        *puVar13 = 0;
        pOVar19 = pIVar17->m_src1;
      }
      if (pOVar20 == pOVar19) {
        if (pIVar17->m_src2 == (Opnd *)0x0) {
          IR::Instr::FreeSrc1(pIVar17);
          pIVar17->m_opcode = Nop;
        }
        else {
          pOVar19 = IR::Instr::UnlinkSrc2(pIVar17);
          IR::Instr::ReplaceSrc1(pIVar17,pOVar19);
        }
      }
      else {
        if (pOVar20 != pIVar17->m_src2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x12b7,"(use == noImplicitCallUsesInstr->GetSrc2())",
                             "use == noImplicitCallUsesInstr->GetSrc2()");
          if (!bVar4) goto LAB_003e31c1;
          *puVar13 = 0;
        }
        IR::Instr::FreeSrc2(pIVar17);
      }
      this_02 = (RegOpnd *)0x0;
LAB_003e315d:
      bVar4 = (char)local_50 == '\0';
      goto LAB_003e3161;
    }
    goto LAB_003e2cba;
  }
  goto LAB_003e2cd2;
LAB_003e2ca9:
  bVar9 = !bVar4;
  pOVar20 = pOVar19;
  bVar4 = false;
  if (bVar9) goto LAB_003e2cba;
  goto LAB_003e2c1f;
LAB_003e2cba:
  pIVar17 = pIVar17->m_prev;
  uVar5 = arrayValueType.field_0.bits._1_1_;
  if (pIVar17 == (Instr *)0x0) goto LAB_003e2cd2;
  goto LAB_003e2c04;
LAB_003e27e8:
  do {
    if (pIVar17->m_opcode != NoImplicitCallUses) break;
    pOVar19 = pIVar17->m_src2;
    pOVar20 = pIVar17->m_src1;
    bVar4 = true;
    do {
      bVar9 = bVar4;
      if (pOVar20 == (Opnd *)0x0) break;
      bVar4 = IR::Opnd::IsEqual(pOVar20,&pRVar15->super_Opnd);
      if (bVar4) {
        OVar7 = IR::Opnd::GetKind(pOVar20);
        if (OVar7 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = local_50;
          *local_50 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar4) goto LAB_003e31c1;
          *puVar13 = 0;
        }
        if ((StackSym *)pOVar20[1]._vptr_Opnd == local_48->headSegmentLengthSym) {
          IR::RegOpnd::FreeInternal(pRVar15,instr->m_func);
          this_01 = this->considerSymsAsRealUsesInNoImplicitCallUses;
          arrayRegOpnd = local_48;
          goto LAB_003e28df;
        }
      }
      pOVar20 = pOVar19;
      bVar4 = false;
    } while (bVar9);
    pIVar17 = pIVar17->m_prev;
  } while (pIVar17 != (Instr *)0x0);
  goto LAB_003e28ad;
LAB_003e2ef0:
  do {
    if (pIVar17->m_opcode != NoImplicitCallUses) break;
    pRVar15 = (RegOpnd *)pIVar17->m_src2;
    this_02 = (RegOpnd *)pIVar17->m_src1;
    bVar4 = true;
    do {
      bVar9 = bVar4;
      if (this_02 == (RegOpnd *)0x0) break;
      bVar4 = IR::Opnd::IsEqual(&this_02->super_Opnd,(Opnd *)arrayRegOpnd);
      if (bVar4) {
        local_52 = (this_02->super_Opnd).m_valueType.field_0;
        bVar4 = ValueType::IsLikelyObject((ValueType *)&local_52.field_0);
        if (bVar4) {
          OVar10 = ValueType::GetObjectType((ValueType *)&local_52.field_0);
          OVar11 = ValueType::GetObjectType((ValueType *)&local_3a.field_0);
          arrayRegOpnd = local_48;
          if (OVar10 == OVar11) {
            OVar7 = IR::Opnd::GetKind(&this_02->super_Opnd);
            if (OVar7 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar4) goto LAB_003e31c1;
              *puVar13 = 0;
              arrayRegOpnd = local_48;
            }
            bVar4 = IR::RegOpnd::IsArrayRegOpnd(this_02);
            if (bVar4) {
              bVar4 = IR::RegOpnd::IsArrayRegOpnd(this_02);
              if (!bVar4) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
                if (!bVar4) goto LAB_003e31c1;
                *puVar13 = 0;
                arrayRegOpnd = local_48;
              }
              if ((((char)local_50 == '\0') ||
                  ((StackSym *)this_02[1].super_Opnd._vptr_Opnd == arrayRegOpnd->headSegmentSym)) &&
                 (((char)local_38 == '\0' ||
                  (*(StackSym **)&this_02[1].super_Opnd.m_valueType ==
                   arrayRegOpnd->headSegmentLengthSym)))) {
                OVar7 = IR::Opnd::GetKind(&this_02->super_Opnd);
                uVar5 = arrayValueType.field_0.bits._1_1_;
                if (OVar7 != OpndKindReg) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar13 = 1;
                  bVar4 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                  if (!bVar4) goto LAB_003e31c1;
                  *puVar13 = 0;
                }
                bVar4 = IR::RegOpnd::IsArrayRegOpnd(this_02);
                if (bVar4) {
                  uVar16 = (ulong)local_38;
                  goto LAB_003e29af;
                }
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
                if (!bVar4) goto LAB_003e31c1;
                *puVar13 = 0;
                goto LAB_003e315d;
              }
            }
          }
        }
      }
      this_02 = pRVar15;
      bVar4 = false;
    } while (bVar9);
    pIVar17 = pIVar17->m_prev;
  } while (pIVar17 != (Instr *)0x0);
LAB_003e3062:
  this_02 = (RegOpnd *)0x0;
  bVar4 = (char)local_50 == '\0';
  uVar5 = arrayValueType.field_0.bits._1_1_;
LAB_003e3161:
  cVar8 = (char)local_38;
  if (!bVar4) {
LAB_003e3166:
    if (((uVar5 != '\0') || (arrayRegOpnd->headSegmentLengthSym == (StackSym *)0x0)) ||
       (cVar8 != '\0')) {
      arrayRegOpnd->headSegmentSym = (StackSym *)0x0;
      instr->field_0x37 = instr->field_0x37 & 0xfb;
      if (this_02 == (RegOpnd *)0x0) {
        this_02 = (RegOpnd *)0x0;
      }
      else {
        this_02[1].super_Opnd._vptr_Opnd = (_func_int **)0x0;
      }
    }
  }
LAB_003e3195:
  if (cVar8 != '\0') {
    arrayRegOpnd->headSegmentLengthSym = (StackSym *)0x0;
    instr->field_0x37 = instr->field_0x37 & 0xf7;
    if (this_02 != (RegOpnd *)0x0) {
      this_02[1].super_Opnd.m_valueType = (anon_union_2_4_ea848c7b_for_ValueType_13)0x0;
      this_02[1].super_Opnd.m_type = TyIllegal;
      this_02[1].super_Opnd.field_0xb = 0;
      this_02[1].super_Opnd.m_kind = OpndKindInvalid;
      this_02[1].super_Opnd.isDeleted = false;
      *(undefined2 *)&this_02[1].super_Opnd.field_0xe = 0;
    }
  }
LAB_003e24b3:
  if (uVar5 == '\0') {
    if (instr->m_opcode != NoImplicitCallUses) {
      return;
    }
    goto LAB_003e2508;
  }
  if (arrayRegOpnd->headSegmentSym != (StackSym *)0x0) {
    ProcessStackSymUse(this,arrayRegOpnd->headSegmentSym,'\x01');
  }
LAB_003e254e:
  pSVar14 = arrayRegOpnd->headSegmentLengthSym;
  if (pSVar14 != (StackSym *)0x0) {
    if (uVar5 == '\0') {
      ProcessStackSymUse(this,pSVar14,'\x01');
      BVSparse<Memory::JitArenaAllocator>::Set
                (pBVar2->noImplicitCallUses,(arrayRegOpnd->headSegmentLengthSym->super_Sym).m_id);
      this_01 = pBVar2->noImplicitCallJsArrayHeadSegmentSymUses;
LAB_003e28df:
      BVSparse<Memory::JitArenaAllocator>::Set
                (this_01,(arrayRegOpnd->headSegmentLengthSym->super_Sym).m_id);
    }
    else {
      pRVar15 = IR::RegOpnd::New(pSVar14,pSVar14->m_type,instr->m_func);
      if (instr->m_opcode == NoImplicitCallUses) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1207,"(instr->m_opcode != Js::OpCode::NoImplicitCallUses)",
                           "instr->m_opcode != Js::OpCode::NoImplicitCallUses");
        if (!bVar4) goto LAB_003e31c1;
        *puVar13 = 0;
      }
      for (pIVar17 = instr->m_prev; pIVar17 != (Instr *)0x0; pIVar17 = pIVar17->m_prev) {
        if ((pIVar17->m_kind == InstrKindLabel) || (pIVar17->m_kind == InstrKindProfiledLabel)) {
LAB_003e27cc:
          local_50 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          goto LAB_003e27e8;
        }
        bVar4 = IR::Instr::IsRealInstr(pIVar17);
        if (bVar4) {
          if ((pIVar17->m_kind != InstrKindByteCodeUses) || (pIVar17->m_opcode != ByteCodeUses))
          goto LAB_003e27cc;
        }
        else if (pIVar17->m_opcode == NoImplicitCallUses) goto LAB_003e27cc;
      }
LAB_003e28ad:
      IR::RegOpnd::FreeInternal(pRVar15,instr->m_func);
      arrayRegOpnd = local_48;
    }
  }
  pSVar14 = IR::ArrayRegOpnd::LengthSym(arrayRegOpnd);
  if ((pSVar14 != (StackSym *)0x0) && (pSVar14 != arrayRegOpnd->headSegmentLengthSym)) {
    ProcessStackSymUse(this,pSVar14,'\x01');
    bVar4 = ValueType::IsArray((ValueType *)&local_3a.field_0);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1306,"(arrayValueType.IsArray())","arrayValueType.IsArray()");
      if (!bVar4) {
LAB_003e31c1:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar13 = 0;
    }
    BVSparse<Memory::JitArenaAllocator>::Set(pBVar2->noImplicitCallUses,(pSVar14->super_Sym).m_id);
    BVSparse<Memory::JitArenaAllocator>::Set
              (pBVar2->noImplicitCallArrayLengthSymUses,(pSVar14->super_Sym).m_id);
  }
  return;
}

Assistant:

void
BackwardPass::ProcessArrayRegOpndUse(IR::Instr *const instr, IR::ArrayRegOpnd *const arrayRegOpnd)
{
    Assert(tag == Js::DeadStorePhase);
    Assert(!IsCollectionPass());
    Assert(instr);
    Assert(arrayRegOpnd);

    if(!(arrayRegOpnd->HeadSegmentSym() || arrayRegOpnd->HeadSegmentLengthSym() || arrayRegOpnd->LengthSym()))
    {
        return;
    }

    const ValueType arrayValueType(arrayRegOpnd->GetValueType());
    const bool isJsArray = !arrayValueType.IsLikelyTypedArray();
    Assert(isJsArray == arrayValueType.IsArrayOrObjectWithArray());
    Assert(!isJsArray == arrayValueType.IsOptimizedTypedArray());

    BasicBlock *const block = currentBlock;
    if(!IsPrePass() &&
        (arrayRegOpnd->HeadSegmentSym() || arrayRegOpnd->HeadSegmentLengthSym()) &&
        (!isJsArray || instr->m_opcode != Js::OpCode::NoImplicitCallUses))
    {
        bool headSegmentIsLoadedButUnused =
            instr->loadedArrayHeadSegment &&
            arrayRegOpnd->HeadSegmentSym() &&
            !block->upwardExposedUses->Test(arrayRegOpnd->HeadSegmentSym()->m_id);
        const bool headSegmentLengthIsLoadedButUnused =
            instr->loadedArrayHeadSegmentLength &&
            arrayRegOpnd->HeadSegmentLengthSym() &&
            !block->upwardExposedUses->Test(arrayRegOpnd->HeadSegmentLengthSym()->m_id);
        if(headSegmentLengthIsLoadedButUnused && instr->extractedUpperBoundCheckWithoutHoisting)
        {
            // Find the upper bound check (index[src1] <= headSegmentLength[src2] + offset[dst])
            IR::Instr *upperBoundCheck = this->globOpt->FindUpperBoundsCheckInstr(instr);
            Assert(upperBoundCheck && upperBoundCheck != instr);
            Assert(upperBoundCheck->GetSrc2()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym());

            // Find the head segment length load
            IR::Instr *headSegmentLengthLoad = this->globOpt->FindArraySegmentLoadInstr(upperBoundCheck);

            Assert(headSegmentLengthLoad->GetDst()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym());
            Assert(
                headSegmentLengthLoad->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->m_sym ==
                (isJsArray ? arrayRegOpnd->HeadSegmentSym() : arrayRegOpnd->m_sym));

            // Fold the head segment length load into the upper bound check. Keep the load instruction there with a Nop so that
            // the head segment length sym can be marked as unused before the Nop. The lowerer will remove it.
            upperBoundCheck->ReplaceSrc2(headSegmentLengthLoad->UnlinkSrc1());
            headSegmentLengthLoad->m_opcode = Js::OpCode::Nop;

            if(isJsArray)
            {
                // The head segment length is on the head segment, so the bound check now uses the head segment sym
                headSegmentIsLoadedButUnused = false;
            }
        }

        if(headSegmentIsLoadedButUnused || headSegmentLengthIsLoadedButUnused)
        {
            // Check if the head segment / head segment length are being loaded here. If so, remove them and let the fast
            // path load them since it does a better job.
            IR::ArrayRegOpnd *noImplicitCallArrayUse = nullptr;
            if(isJsArray)
            {
                IR::Opnd *const use =
                    FindNoImplicitCallUse(
                        instr,
                        arrayRegOpnd,
                        [&](IR::Opnd *const checkedSrc) -> bool
                        {
                            const ValueType checkedSrcValueType(checkedSrc->GetValueType());
                            if(!checkedSrcValueType.IsLikelyObject() ||
                                checkedSrcValueType.GetObjectType() != arrayValueType.GetObjectType())
                            {
                                return false;
                            }

                            IR::RegOpnd *const checkedRegSrc = checkedSrc->AsRegOpnd();
                            if(!checkedRegSrc->IsArrayRegOpnd())
                            {
                                return false;
                            }

                            IR::ArrayRegOpnd *const checkedArraySrc = checkedRegSrc->AsArrayRegOpnd();
                            if(headSegmentIsLoadedButUnused &&
                                checkedArraySrc->HeadSegmentSym() != arrayRegOpnd->HeadSegmentSym())
                            {
                                return false;
                            }
                            if(headSegmentLengthIsLoadedButUnused &&
                                checkedArraySrc->HeadSegmentLengthSym() != arrayRegOpnd->HeadSegmentLengthSym())
                            {
                                return false;
                            }
                            return true;
                        });
                if(use)
                {
                    noImplicitCallArrayUse = use->AsRegOpnd()->AsArrayRegOpnd();
                }
            }
            else if(headSegmentLengthIsLoadedButUnused)
            {
                // A typed array's head segment length may be zeroed when the typed array's buffer is transferred to a web
                // worker, so the head segment length sym use is included in a NoImplicitCallUses instruction. Since there
                // are no forward uses of the head segment length sym, to allow removing the extracted head segment length
                // load, the corresponding head segment length sym use in the NoImplicitCallUses instruction must also be
                // removed.
                IR::Instr *noImplicitCallUsesInstr;
                IR::Opnd *const use =
                    FindNoImplicitCallUse(
                        instr,
                        arrayRegOpnd->HeadSegmentLengthSym(),
                        [&](IR::Opnd *const checkedSrc) -> bool
                        {
                            return checkedSrc->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym();
                        },
                        &noImplicitCallUsesInstr);
                if(use)
                {
                    Assert(noImplicitCallUsesInstr);
                    Assert(!noImplicitCallUsesInstr->GetDst());
                    Assert(noImplicitCallUsesInstr->GetSrc1());
                    if(use == noImplicitCallUsesInstr->GetSrc1())
                    {
                        if(noImplicitCallUsesInstr->GetSrc2())
                        {
                            noImplicitCallUsesInstr->ReplaceSrc1(noImplicitCallUsesInstr->UnlinkSrc2());
                        }
                        else
                        {
                            noImplicitCallUsesInstr->FreeSrc1();
                            noImplicitCallUsesInstr->m_opcode = Js::OpCode::Nop;
                        }
                    }
                    else
                    {
                        Assert(use == noImplicitCallUsesInstr->GetSrc2());
                        noImplicitCallUsesInstr->FreeSrc2();
                    }
                }
            }

            if(headSegmentIsLoadedButUnused &&
                (!isJsArray || !arrayRegOpnd->HeadSegmentLengthSym() || headSegmentLengthIsLoadedButUnused))
            {
                // For JS arrays, the head segment length load is dependent on the head segment. So, only remove the head
                // segment load if the head segment length load can also be removed.
                arrayRegOpnd->RemoveHeadSegmentSym();
                instr->loadedArrayHeadSegment = false;
                if(noImplicitCallArrayUse)
                {
                    noImplicitCallArrayUse->RemoveHeadSegmentSym();
                }
            }
            if(headSegmentLengthIsLoadedButUnused)
            {
                arrayRegOpnd->RemoveHeadSegmentLengthSym();
                instr->loadedArrayHeadSegmentLength = false;
                if(noImplicitCallArrayUse)
                {
                    noImplicitCallArrayUse->RemoveHeadSegmentLengthSym();
                }
            }
        }
    }

    if(isJsArray && instr->m_opcode != Js::OpCode::NoImplicitCallUses)
    {
        // Only uses in NoImplicitCallUses instructions are counted toward liveness
        return;
    }

    // Treat dependent syms as uses. For JS arrays, only uses in NoImplicitCallUses count because only then the assumptions made
    // on the dependent syms are guaranteed to be valid. Similarly for typed arrays, a head segment length sym use counts toward
    // liveness only in a NoImplicitCallUses instruction.
    if(arrayRegOpnd->HeadSegmentSym())
    {
        ProcessStackSymUse(arrayRegOpnd->HeadSegmentSym(), true);
        if(isJsArray)
        {
            block->noImplicitCallUses->Set(arrayRegOpnd->HeadSegmentSym()->m_id);
            block->noImplicitCallJsArrayHeadSegmentSymUses->Set(arrayRegOpnd->HeadSegmentSym()->m_id);
        }
    }
    if(arrayRegOpnd->HeadSegmentLengthSym())
    {
        if(isJsArray)
        {
            ProcessStackSymUse(arrayRegOpnd->HeadSegmentLengthSym(), true);
            block->noImplicitCallUses->Set(arrayRegOpnd->HeadSegmentLengthSym()->m_id);
            block->noImplicitCallJsArrayHeadSegmentSymUses->Set(arrayRegOpnd->HeadSegmentLengthSym()->m_id);
        }
        else
        {
            // ProcessNoImplicitCallUses automatically marks JS array reg opnds and their corresponding syms as live. A typed
            // array's head segment length sym also needs to be marked as live at its use in the NoImplicitCallUses instruction,
            // but it is just in a reg opnd. Flag the opnd to have the sym be marked as live when that instruction is processed.
            IR::Opnd *const use =
                FindNoImplicitCallUse(
                    instr,
                    arrayRegOpnd->HeadSegmentLengthSym(),
                    [&](IR::Opnd *const checkedSrc) -> bool
                    {
                        return checkedSrc->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym();
                    });
            if(use)
            {
                considerSymsAsRealUsesInNoImplicitCallUses->Set(arrayRegOpnd->HeadSegmentLengthSym()->m_id);
            }
        }
    }
    StackSym *const lengthSym = arrayRegOpnd->LengthSym();
    if(lengthSym && lengthSym != arrayRegOpnd->HeadSegmentLengthSym())
    {
        ProcessStackSymUse(lengthSym, true);
        Assert(arrayValueType.IsArray());
        block->noImplicitCallUses->Set(lengthSym->m_id);
        block->noImplicitCallArrayLengthSymUses->Set(lengthSym->m_id);
    }
}